

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O1

void __thiscall
Imf_2_5::DeepTiledOutputFile::DeepTiledOutputFile(DeepTiledOutputFile *this,OutputPartData *part)

{
  size_t __n;
  int iVar1;
  string *psVar2;
  Data *pDVar3;
  ArgExc *this_00;
  stringstream _iex_replace_s;
  
  GenericOutputFile::GenericOutputFile(&this->super_GenericOutputFile);
  (this->super_GenericOutputFile)._vptr_GenericOutputFile =
       (_func_int **)&PTR__DeepTiledOutputFile_0043cae0;
  psVar2 = Header::type_abi_cxx11_(&part->header);
  __n = psVar2->_M_string_length;
  if (__n == _DAT_004418e8) {
    if (__n != 0) {
      iVar1 = bcmp((psVar2->_M_dataplus)._M_p,Imf_2_5::DEEPTILE_abi_cxx11_,__n);
      if (iVar1 != 0) goto LAB_001fdc09;
    }
    pDVar3 = (Data *)operator_new(0x1d0);
    Data::Data(pDVar3,part->numThreads);
    this->_data = pDVar3;
    pDVar3->_streamData = part->mutex;
    pDVar3->_deleteStream = false;
    initialize(this,&part->header);
    pDVar3 = this->_data;
    pDVar3->partNumber = part->partNumber;
    pDVar3->tileOffsetsPosition = part->chunkOffsetTablePosition;
    pDVar3->previewPosition = part->previewPosition;
    pDVar3->multipart = part->multipart;
    return;
  }
LAB_001fdc09:
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(this_00,"Can\'t build a DeepTiledOutputFile from a type-mismatched part.")
  ;
  __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

DeepTiledOutputFile::DeepTiledOutputFile(const OutputPartData* part) 
{
   
    try
    {
        if (part->header.type() != DEEPTILE)
            throw IEX_NAMESPACE::ArgExc("Can't build a DeepTiledOutputFile from "
                              "a type-mismatched part.");

        _data = new Data (part->numThreads);
        _data->_streamData=part->mutex;
        _data->_deleteStream=false;
        initialize(part->header);
        _data->partNumber = part->partNumber;
        _data->tileOffsetsPosition = part->chunkOffsetTablePosition;
        _data->previewPosition = part->previewPosition;
	_data->multipart = part->multipart;
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        if (_data) delete _data;

        REPLACE_EXC (e, "Cannot initialize output part "
                     "\"" << part->partNumber << "\". " << e.what());
        throw;
    }
    catch (...)
    {
        if (_data) delete _data;

        throw;
    }
}